

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_datarate_test.cc
# Opt level: O0

void __thiscall
datarate_test::(anonymous_namespace)::DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test::
~DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test
          (DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test *this)

{
  DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test *in_stack_00000010;
  
  anon_unknown_0::DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test::
  ~DatarateTestSVC_BasicRateTargetingSVC1TL1SLIntraOnly_Test(in_stack_00000010);
  return;
}

Assistant:

TEST_P(DatarateTestSVC, BasicRateTargetingSVC1TL1SLIntraOnly) {
  BasicRateTargetingSVC1TL1SLIntraOnlyTest();
}